

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorExpressionContext.cxx
# Opt level: O3

void __thiscall
cmGeneratorExpressionContext::cmGeneratorExpressionContext
          (cmGeneratorExpressionContext *this,cmMakefile *mf,string *config,bool quiet,
          cmTarget *headTarget,cmTarget *currentTarget,bool evaluateForBuildsystem,
          cmListFileBacktrace *backtrace,string *language)

{
  _Rb_tree_header *p_Var1;
  pointer pcVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::vector
            ((vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)this,
             &backtrace->super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>);
  (this->Backtrace).Snapshot.Position.Position = (backtrace->Snapshot).Position.Position;
  uVar3 = *(undefined4 *)((long)&(backtrace->Snapshot).State + 4);
  uVar4 = *(undefined4 *)&(backtrace->Snapshot).Position.Tree;
  uVar5 = *(undefined4 *)((long)&(backtrace->Snapshot).Position.Tree + 4);
  *(undefined4 *)&(this->Backtrace).Snapshot.State = *(undefined4 *)&(backtrace->Snapshot).State;
  *(undefined4 *)((long)&(this->Backtrace).Snapshot.State + 4) = uVar3;
  *(undefined4 *)&(this->Backtrace).Snapshot.Position.Tree = uVar4;
  *(undefined4 *)((long)&(this->Backtrace).Snapshot.Position.Tree + 4) = uVar5;
  p_Var1 = &(this->DependTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->DependTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->AllTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->AllTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SeenTargetProperties)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->SourceSensitiveTargets)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->MaxLanguageStandard)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  this->Makefile = mf;
  (this->Config)._M_dataplus._M_p = (pointer)&(this->Config).field_2;
  pcVar2 = (config->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Config,pcVar2,pcVar2 + config->_M_string_length);
  (this->Language)._M_dataplus._M_p = (pointer)&(this->Language).field_2;
  pcVar2 = (language->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->Language,pcVar2,pcVar2 + language->_M_string_length);
  this->HeadTarget = headTarget;
  this->CurrentTarget = currentTarget;
  this->Quiet = quiet;
  this->HadError = false;
  this->HadContextSensitiveCondition = false;
  this->HadHeadSensitiveCondition = false;
  this->EvaluateForBuildsystem = evaluateForBuildsystem;
  return;
}

Assistant:

cmGeneratorExpressionContext::cmGeneratorExpressionContext(
      cmMakefile* mf, std::string const& config,
      bool quiet, cmTarget const* headTarget,
      cmTarget const* currentTarget,
      bool evaluateForBuildsystem,
      cmListFileBacktrace const& backtrace,
      std::string const& language)
  : Backtrace(backtrace),
    Makefile(mf),
    Config(config),
    Language(language),
    HeadTarget(headTarget),
    CurrentTarget(currentTarget),
    Quiet(quiet),
    HadError(false),
    HadContextSensitiveCondition(false),
    HadHeadSensitiveCondition(false),
    EvaluateForBuildsystem(evaluateForBuildsystem)
{
}